

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppTVar3;
  bool bVar4;
  int iVar5;
  pointer ppTVar6;
  TestPartResult *pTVar7;
  ostream *poVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  pointer pbVar13;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  TestResult *this_00;
  pointer ppEVar14;
  pointer pbVar15;
  byte bVar16;
  pointer ppEVar17;
  long lVar18;
  timeval now;
  allocator local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  uint local_58;
  int local_54;
  pointer local_50;
  pointer local_48;
  long local_40;
  undefined8 local_38;
  undefined8 uVar19;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&g_argvs_abi_cxx11_);
  pbVar13 = local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar15 = (pointer)CONCAT44(local_78.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_78.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  bVar16 = 1;
  if (g_help_flag == '\0') {
    PostFlagParsingInit(this);
    WriteToShardStatusFileIfNeeded();
    pIVar1 = (this->internal_run_death_test_flag_)._M_t.
             super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>.
             _M_head_impl;
    bVar4 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                        pIVar1 != (InternalRunDeathTestFlag *)0x0);
    local_54 = FilterTests(this,(uint)!bVar4);
    if (FLAGS_gtest_list_tests == '\x01') {
      ListTestsMatchingFilter(this);
      bVar16 = 1;
    }
    else {
      iVar9 = 0;
      if (FLAGS_gtest_shuffle == '\x01') {
        iVar9 = FLAGS_gtest_random_seed;
        if (FLAGS_gtest_random_seed == 0) {
          gettimeofday((timeval *)&local_78,(__timezone_ptr_t)0x0);
          iVar9 = ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) *
                                SEXT816((long)local_78.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish),8) >> 7) -
                  (SUB164(SEXT816(0x20c49ba5e353f7cf) *
                          SEXT816((long)local_78.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish),0xc) >> 0x1f)) +
                  (int)local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start * 1000;
        }
        iVar9 = (iVar9 - 1U) % 99999 + 1;
      }
      this->random_seed_ = iVar9;
      pTVar2 = (this->listeners_).repeater_;
      gettimeofday((timeval *)&local_78,(__timezone_ptr_t)0x0);
      this->start_timestamp_ =
           (long)local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish / 1000 +
           CONCAT44(local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (int)local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) * 1000;
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2);
      uVar11 = 1;
      if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
        uVar11 = FLAGS_gtest_repeat;
      }
      if (uVar11 == 0) {
        bVar16 = 1;
      }
      else {
        local_50 = pbVar13;
        uVar19 = 0;
        uVar12 = 0;
        local_58 = uVar11;
        local_48 = pbVar15;
        do {
          ppTVar3 = (this->test_suites_).
                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          local_38 = uVar19;
          for (ppTVar6 = (this->test_suites_).
                         super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppTVar6 != ppTVar3;
              ppTVar6 = ppTVar6 + 1) {
            TestSuite::ClearResult(*ppTVar6);
          }
          gettimeofday((timeval *)&local_78,(__timezone_ptr_t)0x0);
          lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                          SEXT816((long)local_78.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish),8);
          local_40 = CONCAT44(local_78.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_78.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          if (local_54 < 1) {
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                      (pTVar2,this->parent_,uVar12);
          }
          else {
            if (FLAGS_gtest_shuffle == '\x01') {
              (this->random_).state_ = this->random_seed_;
              ShuffleTests(this);
            }
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                      (pTVar2,this->parent_,uVar12);
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
            ppEVar14 = (this->environments_).
                       super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            for (ppEVar17 = (this->environments_).
                            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppEVar17 != ppEVar14;
                ppEVar17 = ppEVar17 + 1) {
              (**(code **)(*(long *)*ppEVar17 + 0x10))();
            }
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
            bVar4 = Test::IsSkipped();
            if (bVar4) {
              UnitTest::GetInstance();
              if ((UnitTest::GetInstance::instance.impl_)->current_test_info_ == (TestInfo *)0x0) {
                if ((UnitTest::GetInstance::instance.impl_)->current_test_suite_ == (TestSuite *)0x0
                   ) {
                  this_00 = &(UnitTest::GetInstance::instance.impl_)->ad_hoc_test_result_;
                }
                else {
                  this_00 = &(UnitTest::GetInstance::instance.impl_)->current_test_suite_->
                             ad_hoc_test_result_;
                }
              }
              else {
                this_00 = &(UnitTest::GetInstance::instance.impl_)->current_test_info_->result_;
              }
              if (0 < (int)((ulong)((long)(this_00->test_part_results_).
                                          super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this_00->test_part_results_).
                                         super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x49249249) {
                iVar9 = 0;
                do {
                  pTVar7 = TestResult::GetTestPartResult(this_00,iVar9);
                  if (pTVar7->type_ == kSkip) {
                    std::__cxx11::string::string
                              ((string *)&local_78,(pTVar7->message_)._M_dataplus._M_p,&local_79);
                    puts((char *)CONCAT44(local_78.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)local_78.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start));
                    if ((pointer *)
                        CONCAT44(local_78.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_78.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) !=
                        &local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_78.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               (int)local_78.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                                      (ulong)((long)&((local_78.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + 1));
                    }
                  }
                  iVar9 = iVar9 + 1;
                  iVar5 = (int)((ulong)((long)(this_00->test_part_results_).
                                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this_00->test_part_results_).
                                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
                } while (SBORROW4(iVar9,iVar5 * -0x49249249) != iVar9 + iVar5 * 0x49249249 < 0);
              }
              fflush(_stdout);
            }
            else {
              bVar4 = Test::HasFatalFailure();
              if ((!bVar4) &&
                 (ppTVar6 = (this->test_suites_).
                            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 0 < (int)((ulong)((long)(this->test_suites_).
                                         super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6)
                          >> 3))) {
                lVar18 = 0;
                do {
                  TestSuite::Run(ppTVar6[(uint)(this->test_suite_indices_).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[lVar18]]);
                  lVar18 = lVar18 + 1;
                  ppTVar6 = (this->test_suites_).
                            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                } while (lVar18 < (int)((ulong)((long)(this->test_suites_).
                                                                                                            
                                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)ppTVar6) >> 3));
              }
            }
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])(pTVar2,this->parent_);
            ppEVar17 = (this->environments_).
                       super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            for (ppEVar14 = (this->environments_).
                            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish; ppEVar14 != ppEVar17;
                ppEVar14 = ppEVar14 + -1) {
              (**(code **)(*(long *)ppEVar14[-1] + 0x18))();
            }
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2);
          }
          gettimeofday((timeval *)&local_78,(__timezone_ptr_t)0x0);
          this->elapsed_time_ =
               (CONCAT44(local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         (int)local_78.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) - local_40) * 1000 +
               (long)local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish / 1000 +
               ((lVar10 >> 7) - (lVar10 >> 0x3f));
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xf])
                    (pTVar2,this->parent_,uVar12);
          bVar4 = Passed(this);
          UnshuffleTests(this);
          if (FLAGS_gtest_shuffle == '\x01') {
            iVar9 = this->random_seed_;
            if (0x1869e < iVar9 - 1U) {
              GTestLog::GTestLog((GTestLog *)&local_78,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-internal-inl.h"
                                 ,0x93);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Condition 1 <= seed && seed <= kMaxRandomSeed failed. ",0x36);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Invalid random seed ",0x14);
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," - must be in [1, ",0x12);
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,99999);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"].",2);
              GTestLog::~GTestLog((GTestLog *)&local_78);
            }
            iVar5 = iVar9 + 1;
            if (0x1869e < iVar9) {
              iVar5 = 1;
            }
            this->random_seed_ = iVar5;
          }
          bVar16 = (byte)local_38 | !bVar4;
          uVar19 = CONCAT71((int7)((ulong)local_38 >> 8),bVar16);
          uVar11 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar11;
        } while (uVar11 != local_58 || (int)local_58 < 0);
        bVar16 = bVar16 ^ 1;
        pbVar13 = local_50;
        pbVar15 = local_48;
      }
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0x10])(pTVar2,this->parent_);
      if (pbVar13 == pbVar15) {
        ColoredPrintf(COLOR_RED,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
    }
  }
  return (bool)(bVar16 & 1);
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test =
      (internal_run_death_test_flag_.get() != nullptr);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;
  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    const TimeInMillis start = GetTimeInMillis();

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(static_cast<UInt32>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = GetTimeInMillis() - start;

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        COLOR_RED,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(COLOR_RED,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}